

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O0

Options * __thiscall
draco::DracoOptions<draco::GeometryAttribute::Type>::GetAttributeOptions
          (DracoOptions<draco::GeometryAttribute::Type> *this,Type *att_key)

{
  bool bVar1;
  map<draco::GeometryAttribute::Type,_draco::Options,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
  *this_00;
  _Rb_tree_iterator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_> this_01;
  pointer ppVar2;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<Type,_Options>_>::value,_pair<iterator,_bool>_>
  _Var3;
  Options new_options;
  iterator it;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  Options *in_stack_ffffffffffffff20;
  pair<draco::GeometryAttribute::Type,_draco::Options> *__x;
  pair<draco::GeometryAttribute::Type,_draco::Options> local_58;
  _Self local_20 [3];
  Options *local_8;
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<draco::GeometryAttribute::Type,_draco::Options,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
       ::find((map<draco::GeometryAttribute::Type,_draco::Options,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
               *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),(key_type *)0x1554d5)
  ;
  local_58.second.options_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<draco::GeometryAttribute::Type,_draco::Options,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
               ::end((map<draco::GeometryAttribute::Type,_draco::Options,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  bVar1 = std::operator!=(local_20,(_Self *)((long)&local_58.second.options_._M_t._M_impl.
                                                    super__Rb_tree_header + 0x20));
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>::
             operator->((_Rb_tree_iterator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>
                         *)in_stack_ffffffffffffff20);
    local_8 = &ppVar2->second;
  }
  else {
    __x = &local_58;
    Options::Options((Options *)0x15553e);
    this_00 = (map<draco::GeometryAttribute::Type,_draco::Options,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
               *)(in_RDI + 0x30);
    std::make_pair<draco::GeometryAttribute::Type_const&,draco::Options&>
              (&__x->first,in_stack_ffffffffffffff20);
    _Var3 = std::
            map<draco::GeometryAttribute::Type,draco::Options,std::less<draco::GeometryAttribute::Type>,std::allocator<std::pair<draco::GeometryAttribute::Type_const,draco::Options>>>
            ::insert<std::pair<draco::GeometryAttribute::Type,draco::Options>>(this_00,__x);
    this_01 = _Var3.first._M_node;
    local_20[0]._M_node = this_01._M_node;
    std::pair<draco::GeometryAttribute::Type,_draco::Options>::~pair
              ((pair<draco::GeometryAttribute::Type,_draco::Options> *)0x1555c3);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>::
             operator->((_Rb_tree_iterator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>
                         *)this_01._M_node);
    local_8 = &ppVar2->second;
    Options::~Options((Options *)0x1555e9);
  }
  return local_8;
}

Assistant:

Options *DracoOptions<AttributeKeyT>::GetAttributeOptions(
    const AttributeKeyT &att_key) {
  auto it = attribute_options_.find(att_key);
  if (it != attribute_options_.end()) {
    return &it->second;
  }
  Options new_options;
  it = attribute_options_.insert(std::make_pair(att_key, new_options)).first;
  return &it->second;
}